

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
DirectChainedMap<IdentifierLookupResult>::insert
          (DirectChainedMap<IdentifierLookupResult> *this,uint hash,IdentifierLookupResult value)

{
  int iVar1;
  Node *pNVar2;
  undefined4 extraout_var;
  Node *n;
  Node *target;
  uint bucket;
  uint bucketMask;
  uint hash_local;
  DirectChainedMap<IdentifierLookupResult> *this_local;
  IdentifierLookupResult value_local;
  uint *puVar3;
  
  if (this->bucketCount <= this->count + (this->count >> 2)) {
    rehash(this);
  }
  this->count = this->count + 1;
  pNVar2 = this->data + (ulong)(hash & this->bucketCount - 1) * 0x20;
  if (*(long *)(pNVar2 + 0x18) == 0) {
    *(uint *)pNVar2 = hash;
    *(VariableData **)(pNVar2 + 8) = value.variable;
    *(FunctionData **)(pNVar2 + 0x10) = value.function;
    *(Node **)(pNVar2 + 0x18) = pNVar2;
  }
  else {
    iVar1 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x20);
    puVar3 = (uint *)CONCAT44(extraout_var,iVar1);
    *puVar3 = *(uint *)pNVar2;
    *(undefined8 *)(puVar3 + 2) = *(undefined8 *)(pNVar2 + 8);
    *(undefined8 *)(puVar3 + 4) = *(undefined8 *)(pNVar2 + 0x10);
    *(undefined8 *)(puVar3 + 6) = *(undefined8 *)(pNVar2 + 0x18);
    *(uint *)pNVar2 = hash;
    *(VariableData **)(pNVar2 + 8) = value.variable;
    *(FunctionData **)(pNVar2 + 0x10) = value.function;
    *(uint **)(pNVar2 + 0x18) = puVar3;
  }
  return;
}

Assistant:

void insert(unsigned hash, Value value)
	{
		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		count++;

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = hash & bucketMask;

		Node *target = &data[bucket];

		if(target->next == NULL)
		{
			target->hash = hash;
			target->value = value;
			target->next = target; // Cycle lets us know that this is the last node
		}
		else
		{
			Node *n = (Node*)allocator->alloc(sizeof(Node));

			n->hash = target->hash;
			n->value = target->value;
			n->next = target->next;

			target->hash = hash;
			target->value = value;
			target->next = n;
		}
	}